

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int poly(double *A,double *B,double *C,int lA,int lB)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  uVar1 = (lA + lB) - 1;
  if (0 < (int)uVar1) {
    memset(C,0,(ulong)((lB + lA) - 2) * 8 + 8);
    uVar2 = 0;
    do {
      dVar6 = 0.0;
      if (0 < lA) {
        uVar4 = 0;
        uVar3 = uVar2;
        do {
          if (0 < lB) {
            uVar5 = 0;
            do {
              if (uVar3 == uVar5) {
                dVar6 = dVar6 + A[uVar4] * B[uVar5];
              }
              uVar5 = uVar5 + 1;
            } while ((uint)lB != uVar5);
          }
          uVar4 = uVar4 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar4 != (uint)lA);
      }
      C[uVar2] = dVar6;
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar1);
  }
  return uVar1;
}

Assistant:

int poly(double *A, double *B, double *C, int lA, int lB) {
	int lC,i,j,k;
	double temp;
	lC = lA + lB - 1;
	
	for(i = 0; i < lC;++i) {
			C[i] = 0.;
	}
	
	for(i = 0; i < lC;++i) {
		temp = 0.0;
		for(j = 0; j < lA;++j) {
			for(k = 0; k < lB;++k) {
				if (j + k == i) {
					temp += A[j] * B[k];
				}
			}
		}
		C[i] = temp;
			
	}
	
		
	return lC;
}